

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::anon_unknown_0::Disassembler::HandleInstruction
          (Disassembler *this,spv_parsed_instruction_t *inst)

{
  char *pcVar1;
  InstructionDisassembler *this_00;
  pointer *ppSVar2;
  char cVar3;
  short sVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  long lVar7;
  ushort *puVar8;
  spv_parsed_operand_t *psVar9;
  uint32_t *puVar10;
  pointer pPVar11;
  pointer __first;
  mapped_type *pmVar12;
  void *pvVar13;
  size_type sVar14;
  long lVar15;
  ulong uVar16;
  pointer __result;
  pointer pSVar17;
  pointer pSVar18;
  long lVar19;
  _Tp_alloc_type *__alloc;
  SingleBlock *__args;
  SingleBlock *pSVar20;
  SingleBlock *extraout_RDX;
  uint uVar21;
  _Map_pointer __n;
  ControlFlowGraph *cfg;
  uint32_t *puVar22;
  undefined8 *puVar23;
  ulong uVar24;
  uint32_t case_index;
  size_t sVar25;
  size_t index;
  ulong uVar26;
  pointer pPVar27;
  pointer pSVar28;
  uint32_t block_index;
  undefined4 uStack_14c;
  Disassembler *local_148;
  ControlFlowGraph *local_140;
  undefined4 local_134;
  undefined1 local_130 [8];
  pointer local_128;
  spv_parsed_instruction_t *local_118;
  SingleBlock new_block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_order;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_70;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  id_to_index;
  
  this_00 = &this->instruction_disassembler_;
  disassemble::InstructionDisassembler::EmitSectionComment
            (this_00,inst,&this->inserted_decoration_space_,&this->inserted_debug_space_,
             &this->inserted_type_space_);
  if ((this->nested_indent_ != false) || (this->reorder_blocks_ == true)) {
    local_148 = this;
    if (inst->opcode == 0x38) {
      local_140 = &this->current_function_cfg_;
      id_to_index._M_h._M_buckets = &id_to_index._M_h._M_single_bucket;
      id_to_index._M_h._M_bucket_count = 1;
      id_to_index._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      id_to_index._M_h._M_element_count = 0;
      id_to_index._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      id_to_index._M_h._M_rehash_policy._M_next_resize = 0;
      id_to_index._M_h._M_single_bucket = (__node_base_ptr)0x0;
      uVar26 = 0;
      local_118 = inst;
      while( true ) {
        pSVar28 = (local_148->current_function_cfg_).blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(local_148->current_function_cfg_).blocks.
                           super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar28) / 0x58) <=
            uVar26) break;
        lVar15 = *(long *)&pSVar28[uVar26].instructions.
                           super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
        ;
        if (*(short *)(lVar15 + 10) != 0xf8) {
          __assert_fail("static_cast<spv::Op>(block.instructions[0].get()->opcode) == spv::Op::OpLabel"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                        ,0xf3,
                        "std::unordered_map<uint32_t, uint32_t> spvtools::(anonymous namespace)::BuildControlFlowGraph(ControlFlowGraph &)"
                       );
        }
        new_block.byte_offset = CONCAT44(new_block.byte_offset._4_4_,*(undefined4 *)(lVar15 + 0x14))
        ;
        pmVar12 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&id_to_index,(key_type *)&new_block);
        *pmVar12 = (mapped_type)uVar26;
        lVar15 = *(long *)&pSVar28[uVar26].instructions.
                           super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                           ._M_impl;
        pPVar27 = *(pointer *)
                   ((long)&pSVar28[uVar26].instructions.
                           super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                   + 8);
        lVar19 = (long)pPVar27 - lVar15;
        if (2 < (ulong)(lVar19 / 0x30)) {
          sVar4 = *(short *)(lVar15 + -0x56 + lVar19);
          if (sVar4 == 0xf7) {
            pSVar28[uVar26].successors.merge_block_id =
                 *(uint32_t *)
                  (*(long *)(lVar15 + -0x60 + lVar19) +
                  (ulong)**(ushort **)(lVar15 + -0x48 + lVar19) * 4);
          }
          else if (sVar4 == 0xf6) {
            lVar7 = *(long *)(lVar15 + -0x60 + lVar19);
            puVar8 = *(ushort **)(lVar15 + -0x48 + lVar19);
            pSVar28[uVar26].successors.merge_block_id = *(uint32_t *)(lVar7 + (ulong)*puVar8 * 4);
            pSVar28[uVar26].successors.continue_block_id =
                 *(uint32_t *)(lVar7 + (ulong)puVar8[8] * 4);
          }
        }
        if ((ulong)(lVar19 / 0x30) < 2) {
          __assert_fail("block.instructions.size() >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                        ,0x10e,
                        "std::unordered_map<uint32_t, uint32_t> spvtools::(anonymous namespace)::BuildControlFlowGraph(ControlFlowGraph &)"
                       );
        }
        uVar5 = pPVar27[-1].instruction_.opcode;
        if (uVar5 == 0xf9) {
          uVar6 = *(uint32_t *)
                   ((long)pPVar27[-1].instruction_.words +
                   (ulong)(pPVar27[-1].instruction_.operands)->offset * 4);
          if (pSVar28[uVar26].successors.merge_block_id == 0) {
            pSVar28[uVar26].successors.next_block_id = uVar6;
          }
          else {
            pSVar28[uVar26].successors.body_block_id = uVar6;
          }
        }
        else if (uVar5 == 0xfa) {
          lVar15 = (long)pPVar27[-1].instruction_.words;
          psVar9 = pPVar27[-1].instruction_.operands;
          pSVar28[uVar26].successors.true_block_id =
               *(uint32_t *)(lVar15 + (ulong)psVar9[1].offset * 4);
          pSVar28[uVar26].successors.false_block_id =
               *(uint32_t *)(lVar15 + (ulong)psVar9[2].offset * 4);
        }
        else if (uVar5 == 0xfb) {
          lVar15 = 0x10;
          for (uVar16 = 1; uVar16 < pPVar27[-1].instruction_.num_operands; uVar16 = uVar16 + 2) {
            visited._M_t._M_impl._0_4_ =
                 *(undefined4 *)
                  ((long)pPVar27[-1].instruction_.words +
                  (ulong)*(ushort *)((long)&(pPVar27[-1].instruction_.operands)->offset + lVar15) *
                  4);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&pSVar28[uVar26].successors.case_block_ids,(uint *)&visited);
            lVar15 = lVar15 + 0x20;
          }
        }
        uVar26 = uVar26 + 1;
      }
      post_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      post_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      post_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pSVar28->nest_level = 0;
      pSVar28->nest_level_assigned = true;
      new_block.instructions.
      super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
      pvVar13 = operator_new(0x40);
      lVar15 = (long)pvVar13 + 0x18;
      new_block.byte_offset = (size_t)pvVar13;
      new_block.instructions.
      super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(0x200);
      *(pointer *)((long)pvVar13 + 0x18) =
           new_block.instructions.
           super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      new_block.successors._0_8_ =
           &new_block.instructions.
            super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
            ._M_impl.super__Vector_impl_data._M_finish[10].instruction_.num_operands;
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_6_ = (undefined6)lVar15;
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_2_ = (undefined2)((ulong)lVar15 >> 0x30);
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_6_ = (undefined6)new_block.successors._0_8_;
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._6_2_ =
           (undefined2)((ulong)new_block.successors._0_8_ >> 0x30);
      visited._M_t._M_impl._0_4_ = 0;
      visited._M_t._M_impl._4_1_ = 0;
      new_block.instructions.
      super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           new_block.instructions.
           super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      new_block.successors._8_8_ = lVar15;
      new_block.successors._16_8_ =
           new_block.instructions.
           super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)new_block.instructions.
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      std::
      stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
      ::push((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
              *)&new_block,(value_type *)&visited);
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &visited._M_t._M_impl.super__Rb_tree_header._M_header;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      cfg = local_140;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((pointer)new_block.successors._16_8_ !=
             new_block.instructions.
             super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        if ((pointer)new_block.successors._16_8_ ==
            new_block.successors.case_block_ids.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar15 = CONCAT26(new_block.successors.case_block_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._6_2_,
                            new_block.successors.case_block_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_6_);
          block_index = *(undefined4 *)(*(long *)(lVar15 + -8) + 0x1f8);
          cVar3 = *(char *)(*(long *)(lVar15 + -8) + 0x1fc);
          operator_delete(new_block.successors.case_block_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,0x200);
          new_block.successors.case_block_ids.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_6_ = (undefined6)(lVar15 + -8);
          new_block.successors.case_block_ids.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_2_ =
               (undefined2)((ulong)(lVar15 + -8) >> 0x30);
          new_block.successors.case_block_ids.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)(lVar15 + -8);
          new_block.successors.case_block_ids.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish._0_6_ =
               SUB86(new_block.successors.case_block_ids.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x80,0);
          new_block.successors.case_block_ids.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish._6_2_ =
               (undefined2)
               ((ulong)(new_block.successors.case_block_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x80) >> 0x30);
          new_block.successors._16_8_ =
               new_block.successors.case_block_ids.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 0x7e;
          cfg = local_140;
          if (cVar3 != '\x01') goto LAB_001f12fb;
LAB_001f127e:
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&post_order,&block_index);
        }
        else {
          lVar15 = new_block.successors._16_8_ + -8;
          block_index = *(undefined4 *)(new_block.successors._16_8_ + -8);
          pcVar1 = (char *)(new_block.successors._16_8_ + -4);
          new_block.successors._16_8_ = lVar15;
          if (*pcVar1 != '\0') goto LAB_001f127e;
LAB_001f12fb:
          sVar14 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   count(&visited,&block_index);
          if (sVar14 == 0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&visited,&block_index);
            local_130._0_4_ = block_index;
            local_130[4] = true;
            std::
            stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
            ::push((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                    *)&new_block,(value_type *)local_130);
            uVar26 = (ulong)_block_index & 0xffffffff;
            pSVar28 = (cfg->blocks).
                      super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pSVar28[uVar26].nest_level_assigned == false) {
              __assert_fail("block.nest_level_assigned",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                            ,0x145,
                            "void spvtools::(anonymous namespace)::NestSuccessors(ControlFlowGraph &, const SingleBlock &, const std::unordered_map<uint32_t, uint32_t> &)"
                           );
            }
            Nest(cfg,&id_to_index,pSVar28[uVar26].successors.merge_block_id,
                 pSVar28[uVar26].nest_level);
            Nest(cfg,&id_to_index,pSVar28[uVar26].successors.continue_block_id,
                 pSVar28[uVar26].nest_level + 1);
            Nest(cfg,&id_to_index,pSVar28[uVar26].successors.true_block_id,
                 pSVar28[uVar26].nest_level + 2);
            Nest(cfg,&id_to_index,pSVar28[uVar26].successors.false_block_id,
                 pSVar28[uVar26].nest_level + 2);
            Nest(cfg,&id_to_index,pSVar28[uVar26].successors.body_block_id,
                 pSVar28[uVar26].nest_level + 2);
            Nest(cfg,&id_to_index,pSVar28[uVar26].successors.next_block_id,
                 pSVar28[uVar26].nest_level);
            puVar10 = *(pointer *)((long)&pSVar28[uVar26].successors.case_block_ids + 8);
            for (puVar22 = *(uint32_t **)
                            &pSVar28[uVar26].successors.case_block_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                ; puVar22 != puVar10; puVar22 = puVar22 + 1) {
              Nest(local_140,&id_to_index,*puVar22,pSVar28[uVar26].nest_level + 2);
            }
            pSVar28[uVar26].reachable = true;
            VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                           *)&new_block,&id_to_index,pSVar28[uVar26].successors.true_block_id);
            VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                           *)&new_block,&id_to_index,pSVar28[uVar26].successors.false_block_id);
            VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                           *)&new_block,&id_to_index,pSVar28[uVar26].successors.body_block_id);
            VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                           *)&new_block,&id_to_index,pSVar28[uVar26].successors.next_block_id);
            puVar10 = *(pointer *)((long)&pSVar28[uVar26].successors.case_block_ids + 8);
            for (puVar22 = *(uint32_t **)
                            &pSVar28[uVar26].successors.case_block_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                ; puVar22 != puVar10; puVar22 = puVar22 + 1) {
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)&new_block,&id_to_index,*puVar22);
            }
            VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                           *)&new_block,&id_to_index,pSVar28[uVar26].successors.continue_block_id);
            VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                           *)&new_block,&id_to_index,pSVar28[uVar26].successors.merge_block_id);
            cfg = local_140;
          }
        }
      }
      _block_index = post_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
      local_70.current._M_current =
           (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            )(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )post_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_130,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&block_index,&local_70,(allocator_type *)&local_134);
      lVar15 = 0x55;
      uVar26 = 0;
      while( true ) {
        pSVar28 = (local_148->current_function_cfg_).blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(local_148->current_function_cfg_).blocks.
                           super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar28) / 0x58) <=
            uVar26) break;
        if (*(char *)((long)&pSVar28->byte_offset + lVar15) == '\0') {
          local_134 = (undefined4)uVar26;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,
                     (uint *)&local_134);
          *(undefined4 *)((long)pSVar28 + lVar15 + -5) = 0;
          *(undefined1 *)((long)pSVar28 + lVar15 + -1) = 1;
        }
        uVar26 = uVar26 + 1;
        lVar15 = lVar15 + 0x58;
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&visited._M_t);
      sVar25 = new_block.byte_offset;
      this = local_148;
      if (new_block.byte_offset != 0) {
        lVar15 = CONCAT26(new_block.successors.case_block_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._6_2_,
                          new_block.successors.case_block_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_6_);
        for (puVar23 = (undefined8 *)new_block.successors._8_8_;
            puVar23 < (undefined8 *)(lVar15 + 8); puVar23 = puVar23 + 1) {
          operator_delete((void *)*puVar23,0x200);
        }
        operator_delete((void *)sVar25,
                        (long)new_block.instructions.
                              super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                              ._M_impl.super__Vector_impl_data._M_start << 3);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&post_order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      pSVar28 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar20 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)local_128 - CONCAT44(local_130._4_4_,local_130._0_4_) >> 2 !=
          ((long)pSVar20 - (long)pSVar28) / 0x58) {
        __assert_fail("block_order.size() == current_function_cfg_.blocks.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                      ,0x1ef,"void spvtools::(anonymous namespace)::Disassembler::EmitCFG()");
      }
      uVar21 = 0;
      while( true ) {
        uVar26 = (ulong)uVar21;
        if ((ulong)(((long)pSVar20 - (long)pSVar28) / 0x58) <= uVar26) break;
        if (this->reorder_blocks_ == true) {
          uVar26 = (ulong)*(uint *)(CONCAT44(local_130._4_4_,local_130._0_4_) + uVar26 * 4);
        }
        if (pSVar28[uVar26].nest_level_assigned == false) {
          __assert_fail("block.nest_level_assigned",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                        ,0x1fa,"void spvtools::(anonymous namespace)::Disassembler::EmitCFG()");
        }
        pSVar20 = pSVar28 + uVar26;
        sVar25 = pSVar20->byte_offset;
        pPVar11 = (pSVar20->instructions).
                  super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pPVar27 = (pSVar20->instructions).
                       super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar27 != pPVar11;
            pPVar27 = pPVar27 + 1) {
          disassemble::InstructionDisassembler::EmitInstructionInBlock
                    (this_00,&pPVar27->instruction_,sVar25,pSVar20->nest_level);
          sVar25 = sVar25 + (ulong)(pPVar27->instruction_).num_words * 4;
        }
        uVar21 = uVar21 + 1;
        pSVar28 = (local_148->current_function_cfg_).blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar20 = (local_148->current_function_cfg_).blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        this = local_148;
      }
      if (pSVar20 != pSVar28) {
        std::
        _Destroy<spvtools::(anonymous_namespace)::SingleBlock*,spvtools::(anonymous_namespace)::SingleBlock>
                  (pSVar28,pSVar20,
                   (allocator<spvtools::(anonymous_namespace)::SingleBlock> *)
                   (((long)pSVar20 - (long)pSVar28) % 0x58));
        (this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar28;
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_130);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&id_to_index._M_h);
      inst = local_118;
    }
    else if (inst->opcode == 0xf8) {
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_6_ = 0;
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_2_ = 0;
      new_block.nest_level = 0;
      new_block.nest_level_assigned = false;
      new_block.reachable = false;
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_6_ = 0;
      new_block.successors.case_block_ids.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._6_2_ = 0;
      new_block.successors.true_block_id = 0;
      new_block.successors.false_block_id = 0;
      new_block.successors.body_block_id = 0;
      new_block.successors.next_block_id = 0;
      new_block.instructions.
      super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_block.successors.merge_block_id = 0;
      new_block.successors.continue_block_id = 0;
      new_block.instructions.
      super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_block.instructions.
      super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_block.byte_offset = this->byte_offset_;
      id_to_index._M_h._M_buckets = (__buckets_ptr)inst;
      std::
      vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
      ::emplace_back<spv_parsed_instruction_t_const*>
                ((vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
                  *)&new_block.instructions,(spv_parsed_instruction_t **)&id_to_index);
      pSVar18 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar18 ==
          (this->current_function_cfg_).blocks.
          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __first = (this->current_function_cfg_).blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)pSVar18 - (long)__first;
        if (lVar15 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar16 = lVar15 / 0x58;
        pSVar20 = (SingleBlock *)(lVar15 % 0x58);
        uVar26 = 1;
        if (pSVar18 != __first) {
          uVar26 = uVar16;
        }
        uVar24 = uVar26 + uVar16;
        if (0x1745d1745d1745c < uVar24) {
          uVar24 = 0x1745d1745d1745d;
        }
        __alloc = (_Tp_alloc_type *)(uVar26 + uVar16);
        if (CARRY8(uVar26,uVar16)) {
          uVar24 = 0x1745d1745d1745d;
        }
        if (uVar24 == 0) {
          __result = (pointer)0x0;
        }
        else {
          __result = (pointer)operator_new(uVar24 * 0x58);
          pSVar20 = extraout_RDX;
        }
        std::allocator_traits<std::allocator<spvtools::(anonymous_namespace)::SingleBlock>>::
        construct<spvtools::(anonymous_namespace)::SingleBlock,spvtools::(anonymous_namespace)::SingleBlock>
                  ((allocator_type *)(__result + uVar16),&new_block,pSVar20);
        pSVar17 = std::
                  vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ::_S_relocate(__first,pSVar18,__result,__alloc);
        pSVar18 = std::
                  vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ::_S_relocate(pSVar18,pSVar18,pSVar17 + 1,__alloc);
        this = local_148;
        lVar15 = (long)(local_148->current_function_cfg_).blocks.
                       super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
        std::
        _Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ::_M_deallocate((_Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                         *)__first,(pointer)(lVar15 / 0x58),lVar15 % 0x58);
        (this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_start = __result;
        (this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar18;
        (this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar24;
      }
      else {
        std::allocator_traits<std::allocator<spvtools::(anonymous_namespace)::SingleBlock>>::
        construct<spvtools::(anonymous_namespace)::SingleBlock,spvtools::(anonymous_namespace)::SingleBlock>
                  ((allocator_type *)pSVar18,&new_block,__args);
        ppSVar2 = &(this->current_function_cfg_).blocks.
                   super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar2 = *ppSVar2 + 1;
      }
      SingleBlock::~SingleBlock(&new_block);
      goto LAB_001f1787;
    }
    pSVar28 = (this->current_function_cfg_).blocks.
              super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_start != pSVar28) {
      new_block.byte_offset = (size_t)inst;
      std::
      vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
      ::emplace_back<spv_parsed_instruction_t_const*>
                ((vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
                  *)&pSVar28[-1].instructions,(spv_parsed_instruction_t **)&new_block);
      goto LAB_001f1787;
    }
  }
  disassemble::InstructionDisassembler::EmitInstruction(this_00,inst,this->byte_offset_);
LAB_001f1787:
  lVar15 = (ulong)inst->num_words * 4;
  this->byte_offset_ = this->byte_offset_ + lVar15;
  return (spv_result_t)lVar15;
}

Assistant:

spv_result_t Disassembler::HandleInstruction(
    const spv_parsed_instruction_t& inst) {
  instruction_disassembler_.EmitSectionComment(inst, inserted_decoration_space_,
                                               inserted_debug_space_,
                                               inserted_type_space_);

  // When nesting needs to be calculated or when the blocks are reordered, we
  // have to have the full picture of the CFG first.  Defer processing of the
  // instructions until the entire function is visited.  This is not done
  // without those options (even if simpler) to improve debuggability; for
  // example to be able to see whatever is parsed so far even if there is a
  // parse error.
  if (nested_indent_ || reorder_blocks_) {
    switch (static_cast<spv::Op>(inst.opcode)) {
      case spv::Op::OpLabel: {
        // Add a new block to the CFG
        SingleBlock new_block;
        new_block.byte_offset = byte_offset_;
        new_block.instructions.emplace_back(&inst);
        current_function_cfg_.blocks.push_back(std::move(new_block));
        break;
      }
      case spv::Op::OpFunctionEnd:
        // Process the CFG and output the instructions
        EmitCFG();
        // Output OpFunctionEnd itself too
        [[fallthrough]];
      default:
        if (!current_function_cfg_.blocks.empty()) {
          // If in a function, stash the instruction for later.
          current_function_cfg_.blocks.back().instructions.emplace_back(&inst);
        } else {
          // Otherwise emit the instruction right away.
          instruction_disassembler_.EmitInstruction(inst, byte_offset_);
        }
        break;
    }
  } else {
    instruction_disassembler_.EmitInstruction(inst, byte_offset_);
  }

  byte_offset_ += inst.num_words * sizeof(uint32_t);

  return SPV_SUCCESS;
}